

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor)

{
  NameKind in_R9D;
  string_view name;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  AlphaNum local_78;
  AlphaNum local_48;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  if (*(cpp **)(this + 0x20) != (cpp *)0x0) {
    ClassName_abi_cxx11_(&local_98,*(cpp **)(this + 0x20),descriptor);
    local_48.piece_ = absl::lts_20250127::NullSafeStringView("_");
    absl::lts_20250127::StrAppend(&local_b8,&local_78,&local_48);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_78.piece_._M_len = (size_t)**(ushort **)(this + 0x10);
  local_78.piece_._M_str = (char *)(~local_78.piece_._M_len + (long)*(ushort **)(this + 0x10));
  absl::lts_20250127::StrAppend(&local_b8,&local_78);
  if (*(char *)(*(long *)(this + 0x28) + 0x53) == '\x01') {
    local_78.piece_ = absl::lts_20250127::NullSafeStringView("_DoNotUse");
    absl::lts_20250127::StrAppend(&local_b8,&local_78);
  }
  name._M_str = (char *)0x0;
  name._M_len = (size_t)local_b8._M_dataplus._M_p;
  ResolveKnownNameCollisions_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_b8._M_string_length,name,kFile,in_R9D);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const Descriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  std::string res;
  if (parent) absl::StrAppend(&res, ClassName(parent), "_");
  absl::StrAppend(&res, descriptor->name());
  if (IsMapEntryMessage(descriptor)) absl::StrAppend(&res, "_DoNotUse");
  // This is the mangled message name which always goes in file scope.
  return ResolveKnownNameCollisions(res, NameContext::kFile, NameKind::kType);
}